

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O0

void w_vmem_destroy(w_vmem *mem,size_t size)

{
  wp_vmem_trace_data *pwVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  long *plStack_20;
  int error;
  wp_vmem_trace_data *trace_data;
  size_t size_local;
  w_vmem *mem_local;
  
  trace_data = (wp_vmem_trace_data *)size;
  size_local = (size_t)mem;
  iVar2 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar2 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_find_data
            (&stack0xffffffffffffffe0,wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,
             0x400,8,(void *)size_local);
  iVar2 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar2 != 0) {
    w_abort(-0xc);
  }
  if (trace_data != (wp_vmem_trace_data *)*plStack_20) {
    w_handle_failed_assertion
              ("size == trace_data->size","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x85);
  }
  if (size_local == 0) {
    w_handle_failed_assertion
              ("mem != NULL","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x89);
  }
  if (*(long *)size_local == 0) {
    w_handle_failed_assertion
              ("mem->addr != NULL","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x8a);
  }
  if (trace_data == (wp_vmem_trace_data *)0x0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x8b);
  }
  pwVar1 = trace_data;
  sVar3 = w_get_alloc_granularity();
  if ((ulong)pwVar1 % sVar3 != 0) {
    w_handle_failed_assertion
              ("size % w_get_alloc_granularity() == 0","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x8c);
  }
  iVar2 = munmap(*(void **)size_local,(size_t)trace_data);
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    wp_log(W_LOG_LVL_WARNING,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
           ,0x93,"failed to release %zu bytes of virtual memory at %p\n",trace_data,
           *(undefined8 *)size_local);
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0x94,iVar2);
  }
  iVar2 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar2 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_remove_data(wp_vmem_tracer_inst.idx_pool,0x400,(void *)size_local);
  iVar2 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar2 != 0) {
    w_abort(-0xc);
  }
  return;
}

Assistant:

void
w_vmem_destroy(
    struct w_vmem *mem,
    size_t size
)
{
#if W_TRACING(ENABLED)
    {
        struct wp_vmem_trace_data *trace_data;

        W_TRACER_FIND_DATA(wp_vmem_tracer, &trace_data, mem);
        W_ASSERT(size == trace_data->size);
    }
#endif

    W_ASSERT(mem != NULL);
    W_ASSERT(mem->addr != NULL);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_alloc_granularity() == 0);

    if (munmap(mem->addr, size) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("release"), size, mem->addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

#if W_TRACING(ENABLED)
    {
        W_TRACER_DETACH_DATA(wp_vmem_tracer, mem);
    }
#endif
}